

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O1

bool __thiscall
sptk::StatisticsAccumulation::GetDiagonalCovariance
          (StatisticsAccumulation *this,Buffer *buffer,
          vector<double,_std::allocator<double>_> *diagonal_covariance)

{
  pointer pdVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  double *pdVar5;
  size_type __new_size;
  long lVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> mean;
  undefined1 local_68 [32];
  Row local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (this->num_statistics_order_ < 2) {
    return false;
  }
  if (diagonal_covariance == (vector<double,_std::allocator<double>_> *)0x0) {
    return false;
  }
  if (buffer->zeroth_order_statistics_ < 1) {
    return false;
  }
  __new_size = (long)this->num_order_ + 1;
  if ((long)(diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != __new_size) {
    std::vector<double,_std::allocator<double>_>::resize(diagonal_covariance,__new_size);
  }
  dVar7 = 1.0 / (double)buffer->zeroth_order_statistics_;
  pdVar1 = (diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (this->numerically_stable_ == true) {
    if (-1 < this->num_order_) {
      lVar6 = 0;
      do {
        local_68._0_8_ = &PTR__Row_00113d20;
        local_68._16_4_ = (int)lVar6;
        local_68._8_8_ = &buffer->second_order_statistics_;
        pdVar5 = SymmetricMatrix::Row::operator[]((Row *)local_68,(int)lVar6);
        pdVar1[lVar6] = *pdVar5 * dVar7;
        bVar4 = lVar6 < this->num_order_;
        lVar6 = lVar6 + 1;
      } while (bVar4);
    }
LAB_00108509:
    bVar4 = true;
  }
  else {
    local_68._0_8_ = (_func_int **)0x0;
    local_68._8_8_ = (SymmetricMatrix *)0x0;
    local_68._16_8_ = (pointer)0x0;
    bVar4 = GetMean(this,buffer,(vector<double,_std::allocator<double>_> *)local_68);
    uVar3 = local_68._0_8_;
    if (bVar4) {
      if (-1 < this->num_order_) {
        lVar6 = 0;
        do {
          local_48._vptr_Row = (_func_int **)&PTR__Row_00113d20;
          local_48.row_ = (int)lVar6;
          local_48.matrix_ = &buffer->second_order_statistics_;
          pdVar5 = SymmetricMatrix::Row::operator[](&local_48,local_48.row_);
          pdVar1[lVar6] =
               *pdVar5 * dVar7 -
               (double)*(_func_int **)(uVar3 + lVar6 * 8) *
               (double)*(_func_int **)(uVar3 + lVar6 * 8);
          bVar2 = lVar6 < this->num_order_;
          lVar6 = lVar6 + 1;
        } while (bVar2);
      }
      if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_68._0_8_);
      }
      if (bVar4) goto LAB_00108509;
    }
    else if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_68._0_8_);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool StatisticsAccumulation::GetDiagonalCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* diagonal_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == diagonal_covariance) {
    return false;
  }

  if (diagonal_covariance->size() != static_cast<std::size_t>(num_order_ + 1)) {
    diagonal_covariance->resize(num_order_ + 1);
  }

  const double z(1.0 / buffer.zeroth_order_statistics_);
  double* variance(&((*diagonal_covariance)[0]));

  if (numerically_stable_) {
    for (int i(0); i <= num_order_; ++i) {
      variance[i] = z * buffer.second_order_statistics_[i][i];
    }
  } else {
    std::vector<double> mean;
    if (!GetMean(buffer, &mean)) {
      return false;
    }
    const double* mu(&(mean[0]));
    for (int i(0); i <= num_order_; ++i) {
      variance[i] = z * buffer.second_order_statistics_[i][i] - mu[i] * mu[i];
    }
  }

  return true;
}